

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::computeTest(SPxSolverBase<double> *this)

{
  int iVar1;
  Status stat;
  SPxOut *pSVar2;
  ostream *poVar3;
  undefined8 uVar4;
  double dVar5;
  char cVar6;
  char *pcVar7;
  int iVar8;
  DIdxSet *this_00;
  long lVar9;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  Verbosity old_verbosity;
  Verbosity local_50 [2];
  undefined1 local_48 [16];
  DIdxSet *local_38;
  
  dVar5 = leavetol(this);
  this->m_pricingViolCoUpToDate = true;
  this->m_pricingViolCo = 0.0;
  (this->infeasibilitiesCo).super_IdxSet.num = 0;
  iVar1 = (this->thevectors->set).thenum;
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = dVar5;
  local_48._12_4_ = extraout_XMM0_Dd;
  iVar8 = (int)((double)iVar1 * this->sparsePricingFactor);
  if (0 < iVar1) {
    this_00 = &this->infeasibilitiesCo;
    local_48._0_8_ = (ulong)dVar5 ^ 0x8000000000000000;
    local_48._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    lVar9 = 0;
    do {
      stat = ((this->super_SPxBasisBase<double>).thedesc.stat)->data[lVar9];
      if (this->theRep * stat < 1) {
        dVar5 = test(this,(int)lVar9,stat);
        (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = dVar5;
        if (this->remainingRoundsEnterCo == 0) {
          if ((double)local_48._0_8_ <= dVar5) {
            (this->isInfeasibleCo).data[lVar9] = 0;
          }
          else {
            this->m_pricingViolCo = this->m_pricingViolCo - dVar5;
            DIdxSet::addIdx(this_00,(int)lVar9);
            (this->isInfeasibleCo).data[lVar9] = 1;
            this->m_numViol = this->m_numViol + 1;
          }
          if (iVar8 < (this->infeasibilitiesCo).super_IdxSet.num) {
            pSVar2 = this->spxout;
            if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
              local_50[1] = 4;
              local_50[0] = pSVar2->m_verbosity;
              (*pSVar2->_vptr_SPxOut[2])(pSVar2,local_50 + 1);
              pSVar2 = this->spxout;
              local_38 = this_00;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar2->m_streams[pSVar2->m_verbosity]," --- using dense pricing",0x18);
              cVar6 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) +
                              cVar6);
              this_00 = local_38;
              std::ostream::put(cVar6);
              std::ostream::flush();
              (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_50);
            }
            this->remainingRoundsEnterCo = 5;
            this->sparsePricingEnterCo = false;
            (this->infeasibilitiesCo).super_IdxSet.num = 0;
          }
        }
        else if (dVar5 < (double)local_48._0_8_) {
          this->m_pricingViolCo = this->m_pricingViolCo - dVar5;
          this->m_numViol = this->m_numViol + 1;
        }
      }
      else {
        (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9] = 0.0;
        if (this->remainingRoundsEnterCo == 0) {
          (this->isInfeasibleCo).data[lVar9] = 0;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->thevectors->set).thenum);
  }
  iVar1 = (this->infeasibilitiesCo).super_IdxSet.num;
  if ((iVar1 == 0) && (this->sparsePricingEnterCo == false)) {
    this->remainingRoundsEnterCo = this->remainingRoundsEnterCo + -1;
  }
  else if ((iVar1 <= iVar8) && (this->sparsePricingEnterCo == false)) {
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (local_50[0] = pSVar2->m_verbosity, 3 < (int)local_50[0])) {
      local_50[1] = 4;
      (*pSVar2->_vptr_SPxOut[2])();
      poVar3 = this->spxout->m_streams[this->spxout->m_verbosity];
      uVar4 = *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8);
      if (this->hyperPricingEnter == true) {
        pcVar7 = " --- using hypersparse pricing, ";
        lVar9 = 0x20;
      }
      else {
        pcVar7 = " --- using sparse pricing, ";
        lVar9 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar9);
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity],"sparsity: ",10);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar9 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x10) = 6;
      *(uint *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar3 + *(long *)(lVar9 + -0x18) + 8) = 4;
      std::ostream::_M_insert<double>
                ((double)(this->infeasibilitiesCo).super_IdxSet.num /
                 (double)(this->thevectors->set).thenum);
      poVar3 = pSVar2->m_streams[pSVar2->m_verbosity];
      lVar9 = *(long *)poVar3;
      *(uint *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar9 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar3 + *(long *)(lVar9 + -0x18) + 8) = (long)(int)uVar4;
      std::ios::widen((char)*(undefined8 *)(lVar9 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_50);
    }
    this->sparsePricingEnterCo = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeTest()
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();
   m_pricingViolCoUpToDate = true;
   m_pricingViolCo = 0;

   infeasibilitiesCo.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * coDim());

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(isBasic(stat))
      {
         theTest[i] = 0.0;

         if(remainingRoundsEnterCo == 0)
            isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         assert(!isBasic(stat));
         theTest[i] = test(i, stat);

         if(remainingRoundsEnterCo == 0)
         {
            if(theTest[i] < -pricingTol)
            {
               assert(infeasibilitiesCo.size() < infeasibilitiesCo.max());
               m_pricingViolCo -= theTest[i];
               infeasibilitiesCo.addIdx(i);
               isInfeasibleCo[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasibleCo[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilitiesCo.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnterCo = SOPLEX_DENSEROUNDS;
               sparsePricingEnterCo = false;
               infeasibilitiesCo.clear();
            }
         }
         else if(theTest[i] < -pricingTol)
         {
            m_pricingViolCo -= theTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilitiesCo.size() == 0 && !sparsePricingEnterCo)
      --remainingRoundsEnterCo;
   else if(infeasibilitiesCo.size() <= sparsitythreshold && !sparsePricingEnterCo)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilitiesCo.size() / coDim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnterCo = true;
   }
}